

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

bool __thiscall
duckdb::LogicalType::GetDecimalProperties(LogicalType *this,uint8_t *width,uint8_t *scale)

{
  LogicalTypeId LVar1;
  bool bVar2;
  optional_ptr<duckdb::ExtraTypeInfo,_true> info;
  optional_ptr<duckdb::ExtraTypeInfo,_true> info_2;
  LogicalType local_40;
  optional_ptr<duckdb::ExtraTypeInfo,_true> local_28;
  
  LVar1 = this->id_;
  if (LVar1 < INTEGER_LITERAL) {
    switch(LVar1) {
    case BOOLEAN:
      *width = '\x01';
      break;
    case TINYINT:
    case UTINYINT:
      *width = '\x03';
      break;
    case SMALLINT:
    case USMALLINT:
      *width = '\x05';
      break;
    case INTEGER:
    case UINTEGER:
      *width = '\n';
      break;
    case BIGINT:
      *width = '\x13';
      break;
    case DECIMAL:
      local_40._0_8_ =
           (this->type_info_).internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      optional_ptr<duckdb::ExtraTypeInfo,_true>::CheckValid
                ((optional_ptr<duckdb::ExtraTypeInfo,_true> *)&local_40);
      *width = *(uint8_t *)&((element_type *)(local_40._0_8_ + 0x38))->_vptr_ExtraTypeInfo;
      local_40._0_8_ =
           (this->type_info_).internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      optional_ptr<duckdb::ExtraTypeInfo,_true>::CheckValid
                ((optional_ptr<duckdb::ExtraTypeInfo,_true> *)&local_40);
      *scale = *(undefined1 *)
                ((long)&((element_type *)(local_40._0_8_ + 0x38))->_vptr_ExtraTypeInfo + 1);
      return true;
    case UBIGINT:
      *width = '\x14';
      break;
    default:
      if (LVar1 == SQLNULL) {
        *width = '\0';
        *scale = '\0';
        return true;
      }
    case DATE:
    case TIME:
    case TIMESTAMP_SEC:
    case TIMESTAMP_MS:
    case TIMESTAMP:
    case TIMESTAMP_NS:
    case FLOAT:
    case DOUBLE:
    case CHAR:
    case VARCHAR:
    case BLOB:
    case INTERVAL:
switchD_00e89eac_caseD_f:
      *width = 0xff;
      *scale = 0xff;
      return false;
    }
  }
  else {
    if (LVar1 == INTEGER_LITERAL) {
      local_28.ptr = (this->type_info_).internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      optional_ptr<duckdb::ExtraTypeInfo,_true>::CheckValid(&local_28);
      LogicalType(&local_40,(LogicalType *)(local_28.ptr + 1));
      bVar2 = GetDecimalProperties(&local_40,width,scale);
      ~LogicalType(&local_40);
      return bVar2;
    }
    if ((LVar1 != UHUGEINT) && (LVar1 != HUGEINT)) goto switchD_00e89eac_caseD_f;
    *width = '&';
  }
  *scale = '\0';
  return true;
}

Assistant:

bool LogicalType::GetDecimalProperties(uint8_t &width, uint8_t &scale) const {
	switch (id_) {
	case LogicalTypeId::SQLNULL:
		width = 0;
		scale = 0;
		break;
	case LogicalTypeId::BOOLEAN:
		width = 1;
		scale = 0;
		break;
	case LogicalTypeId::TINYINT:
		// tinyint: [-127, 127] = DECIMAL(3,0)
		width = 3;
		scale = 0;
		break;
	case LogicalTypeId::SMALLINT:
		// smallint: [-32767, 32767] = DECIMAL(5,0)
		width = 5;
		scale = 0;
		break;
	case LogicalTypeId::INTEGER:
		// integer: [-2147483647, 2147483647] = DECIMAL(10,0)
		width = 10;
		scale = 0;
		break;
	case LogicalTypeId::BIGINT:
		// bigint: [-9223372036854775807, 9223372036854775807] = DECIMAL(19,0)
		width = 19;
		scale = 0;
		break;
	case LogicalTypeId::UTINYINT:
		// UInt8 — [0 : 255]
		width = 3;
		scale = 0;
		break;
	case LogicalTypeId::USMALLINT:
		// UInt16 — [0 : 65535]
		width = 5;
		scale = 0;
		break;
	case LogicalTypeId::UINTEGER:
		// UInt32 — [0 : 4294967295]
		width = 10;
		scale = 0;
		break;
	case LogicalTypeId::UBIGINT:
		// UInt64 — [0 : 18446744073709551615]
		width = 20;
		scale = 0;
		break;
	case LogicalTypeId::HUGEINT:
		// hugeint: max size decimal (38, 0)
		// note that a hugeint is not guaranteed to fit in this
		width = 38;
		scale = 0;
		break;
	case LogicalTypeId::UHUGEINT:
		// hugeint: max size decimal (38, 0)
		// note that a uhugeint is not guaranteed to fit in this
		width = 38;
		scale = 0;
		break;
	case LogicalTypeId::DECIMAL:
		width = DecimalType::GetWidth(*this);
		scale = DecimalType::GetScale(*this);
		break;
	case LogicalTypeId::INTEGER_LITERAL:
		return IntegerLiteral::GetType(*this).GetDecimalProperties(width, scale);
	default:
		// Nonsense values to ensure initialization
		width = 255u;
		scale = 255u;
		// FIXME(carlo): This should be probably a throw, requires checkign the various call-sites
		return false;
	}
	return true;
}